

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> __thiscall
xemmai::t_parser::f_multiplicative(t_parser *this,bool a_assignable)

{
  int iVar1;
  t_script *ptVar2;
  pointer *__ptr;
  undefined7 in_register_00000031;
  long lVar3;
  wchar_t wVar4;
  t_at at;
  t_script *local_50;
  _Alloc_hider local_48;
  size_type sStack_40;
  undefined8 local_38;
  
  lVar3 = CONCAT71(in_register_00000031,a_assignable);
  f_unary(this,a_assignable);
  if (*(char *)(lVar3 + 0x68) == '\0') {
    do {
      iVar1 = *(int *)(lVar3 + 0x88);
      if (iVar1 == 2) {
        wVar4 = L'\x85';
      }
      else {
        wVar4 = L'S';
        if (iVar1 != 7) {
          if (iVar1 != 0xc) {
            return (__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
                    )(__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
                      )this;
          }
          wVar4 = L'l';
        }
      }
      local_38 = *(size_type *)(lVar3 + 0x60);
      local_48._M_p = *(pointer *)(lVar3 + 0x50);
      sStack_40 = *(size_type *)(lVar3 + 0x58);
      t_lexer::f_next((t_lexer *)(lVar3 + 8));
      ptVar2 = (t_script *)operator_new(0x38);
      f_unary((t_parser *)&stack0xffffffffffffffb0,a_assignable);
      (ptVar2->v_path).field_2._M_allocated_capacity = local_38;
      (ptVar2->v_path)._M_dataplus._M_p = local_48._M_p;
      (ptVar2->v_path)._M_string_length = sStack_40;
      (ptVar2->super_t_body)._vptr_t_body = (_func_int **)&PTR__t_binary_0019b250;
      (ptVar2->v_path).field_2._M_local_buf[2] = wVar4;
      (ptVar2->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_map = (_Map_pointer)this->v_module;
      (ptVar2->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_map_size = (size_t)local_50;
      this->v_module = ptVar2;
    } while (*(char *)(lVar3 + 0x68) == '\0');
  }
  return (__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
         )(__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<ast::t_node> t_parser::f_multiplicative(bool a_assignable)
{
	auto node = f_unary(a_assignable);
	while (!v_lexer.f_newline()) {
		t_instruction instruction;
		switch (v_lexer.f_token()) {
		case t_lexer::c_token__ASTERISK:
			instruction = c_instruction__MULTIPLY_TT;
			break;
		case t_lexer::c_token__SLASH:
			instruction = c_instruction__DIVIDE_TT;
			break;
		case t_lexer::c_token__PERCENT:
			instruction = c_instruction__MODULUS_TT;
			break;
		default:
			return node;
		}
		t_at at = v_lexer.f_at();
		v_lexer.f_next();
		node.reset(new ast::t_binary(at, instruction, std::move(node), f_unary(false)));
	}
	return node;
}